

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

void google::protobuf::internal::TcParser::WriteVarintToUnknown<google::protobuf::UnknownFieldSet>
               (MessageLite *msg,int number,int value)

{
  UnknownFieldSet *unknown;
  int value_local;
  int number_local;
  MessageLite *msg_local;
  
  unknown = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                      (&msg->_internal_metadata_);
  WriteVarint(number,(long)value,unknown);
  return;
}

Assistant:

static void WriteVarintToUnknown(MessageLite* msg, int number, int value) {
    internal::WriteVarint(
        number, value,
        msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>());
  }